

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

void __thiscall
tchecker::typed_if_statement_t::typed_if_statement_t
          (typed_if_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_expression_t> *cond,
          shared_ptr<const_tchecker::typed_statement_t> *then_stmt,
          shared_ptr<const_tchecker::typed_statement_t> *else_stmt)

{
  __shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0022bec0;
  (this->super_typed_statement_t)._type = type;
  std::__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t_const,void>
            (local_40,&cond->
                       super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_statement_t_const,void>
            (local_50,&then_stmt->
                       super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_statement_t_const,void>
            (local_60,&else_stmt->
                       super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>
            );
  if_statement_t::if_statement_t
            (&this->super_if_statement_t,&PTR_construction_vtable_56__0022b020,
             (shared_ptr<const_tchecker::expression_t> *)local_40,
             (shared_ptr<const_tchecker::statement_t> *)local_50,
             (shared_ptr<const_tchecker::statement_t> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x22af68;
  *(undefined8 *)&this->super_if_statement_t = 0x22afd8;
  return;
}

Assistant:

typed_if_statement_t::typed_if_statement_t(enum tchecker::statement_type_t type,
                                           std::shared_ptr<tchecker::typed_expression_t const> const & cond,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & then_stmt,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & else_stmt)
    : tchecker::typed_statement_t(type), tchecker::if_statement_t(cond, then_stmt, else_stmt)
{
}